

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_reporter.h
# Opt level: O1

void __thiscall bandit::detail::info_reporter::context_ended(info_reporter *this,char *desc)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&(this->super_progress_reporter).contexts_,
             (this->super_progress_reporter).contexts_.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev);
  iVar1 = this->indentation_;
  this->indentation_ = iVar1 + -1;
  poVar2 = this->stm_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)iVar1 * '\x02' + -2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  pcVar5 = "\x1b[1;34m";
  pcVar6 = "";
  bVar7 = this->colorizer_->colors_enabled_ == false;
  if (bVar7) {
    pcVar5 = "";
  }
  lVar4 = 7;
  if (bVar7) {
    lVar4 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"end ",4);
  bVar7 = this->colorizer_->colors_enabled_;
  if (bVar7 != false) {
    pcVar6 = "\x1b[0m";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,(ulong)bVar7 << 2);
  if (desc == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(desc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,desc,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

virtual void context_ended(const char *desc)
	{
		progress_reporter::context_ended(desc);
		--indentation_;
		stm_
		  << indent()
		  << colorizer_.blue()
		  << "end "
		  << colorizer_.reset()
		  << desc << std::endl;
	}